

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O1

void __thiscall Text::append(Text *this,TextSlice slice)

{
  size_type sVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer puVar4;
  pointer puVar5;
  size_t sVar6;
  const_iterator __s;
  const_iterator cVar7;
  ulong uVar8;
  ulong uVar9;
  
  sVar1 = (this->content)._M_string_length;
  sVar6 = TextSlice::start_offset(&slice);
  sVar2 = (this->content)._M_string_length;
  pcVar3 = (this->content)._M_dataplus._M_p;
  __s = TextSlice::begin_abi_cxx11_(&slice);
  cVar7 = TextSlice::end_abi_cxx11_(&slice);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  replace(&this->content,
          (long)((long)pcVar3 + (sVar2 * 2 - (long)(this->content)._M_dataplus._M_p)) >> 1,0,
          __s._M_current,(long)cVar7._M_current - (long)__s._M_current >> 1);
  puVar4 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)puVar4 -
          (long)(this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start >> 2;
  puVar5 = ((slice.text)->line_offsets).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->line_offsets,puVar4,
             puVar5 + (ulong)slice.start_position.row + 1,puVar5 + (ulong)slice.end_position.row + 1
            );
  puVar4 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
  if (uVar9 < uVar8) {
    do {
      puVar5 = puVar4 + uVar9;
      *puVar5 = *puVar5 + ((int)sVar1 - (int)sVar6);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  return;
}

Assistant:

void Text::append(TextSlice slice) {
  int64_t line_offset_delta = static_cast<int64_t>(content.size()) - static_cast<int64_t>(slice.start_offset());

  content.insert(
    content.end(),
    slice.begin(),
    slice.end()
  );

  size_t original_size = line_offsets.size();
  line_offsets.insert(
    line_offsets.end(),
    slice.text->line_offsets.begin() + slice.start_position.row + 1,
    slice.text->line_offsets.begin() + slice.end_position.row + 1
  );

  for (size_t i = original_size; i < line_offsets.size(); i++) {
    line_offsets[i] += line_offset_delta;
  }
}